

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O0

bool __thiscall stk::FileWrite::setMatFile(FileWrite *this,string *fileName)

{
  int iVar1;
  long lVar2;
  char *__filename;
  FILE *pFVar3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  double dVar7;
  int local_180;
  int local_17c;
  SINT32 tmp;
  SINT32 headsize;
  SINT32 namelength;
  string local_168 [32];
  undefined8 local_148;
  size_t found;
  string name;
  FLOAT64 *sampleRate;
  size_t i;
  MatHeader hdr;
  string *fileName_local;
  FileWrite *this_local;
  
  hdr.adf._36_8_ = fileName;
  lVar2 = std::__cxx11::string::find((char *)fileName,0x11f2a9);
  if (lVar2 == -1) {
    std::__cxx11::string::operator+=((string *)fileName,".mat");
  }
  __filename = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(__filename,"w+b");
  this->fd_ = (FILE *)pFVar3;
  if (this->fd_ == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: could not create MAT file: ");
    std::operator<<(poVar4,(string *)fileName);
    return false;
  }
  if (this->dataType_ != 0x20) {
    this->dataType_ = 0x20;
    poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                             "FileWrite: using 64-bit floating-point data format for file ");
    poVar4 = std::operator<<(poVar4,(string *)fileName);
    std::operator<<(poVar4,'.');
    Stk::handleError(&this->super_Stk,DEBUG_PRINT);
  }
  strcpy((char *)((long)&i + 4),
         "MATLAB 5.0 MAT-file, Generated using the Synthesis ToolKit in C++ (STK). By Perry R. Cook and Gary P. Scavone."
        );
  for (sampleRate = (FLOAT64 *)strlen((char *)((long)&i + 4)); sampleRate < (FLOAT64 *)0x7c;
      sampleRate = (FLOAT64 *)((long)sampleRate + 1)) {
    *(undefined1 *)((long)&i + 4 + (long)sampleRate) = 0x20;
  }
  hdr.heading[0x74] = '\0';
  hdr.heading[0x75] = '\x01';
  hdr.heading[0x76] = 'I';
  hdr.heading[0x77] = 'M';
  hdr.heading[0x78] = '\x0e';
  hdr.heading[0x79] = '\0';
  hdr.heading[0x7a] = '\0';
  hdr.heading[0x7b] = '\0';
  hdr.hff[0] = 0x38;
  hdr.hff[1] = 0;
  hdr.fs[0] = 6;
  hdr.fs[1] = 8;
  hdr.fs[2] = 6;
  hdr.fs[3] = 0;
  hdr.fs[4] = 5;
  hdr.fs[5] = 8;
  hdr.fs[6] = 1;
  hdr.fs[7] = 1;
  hdr.fs[8] = 0x20001;
  hdr.fs[9] = 0x7366;
  hdr.fs[10] = 9;
  hdr.fs[0xb] = 8;
  hdr.fs._48_8_ = Stk::sampleRate();
  hdr.fs[0xe] = 0xe;
  hdr.fs[0xf] = 0;
  hdr.adf[0] = 6;
  hdr.adf[1] = 8;
  hdr.adf[2] = 6;
  hdr.adf[3] = 0;
  hdr.adf[4] = 5;
  hdr.adf[5] = 8;
  hdr.adf[6] = this->channels_;
  hdr.adf[7] = 0;
  std::__cxx11::string::string((string *)&found,(string *)fileName);
  local_148 = std::__cxx11::string::find_last_of((char *)&found,0x11f385);
  std::__cxx11::string::substr((ulong)local_168,(ulong)&found);
  std::__cxx11::string::operator=((string *)&found,local_168);
  std::__cxx11::string::~string(local_168);
  iVar1 = std::__cxx11::string::size();
  tmp = iVar1 + -4;
  if (0x1f < tmp) {
    tmp = 0x1f;
  }
  if (tmp < 5) {
    hdr.adf[8] = tmp * 0x10000 + 1;
  }
  else {
    hdr.adf[8] = 1;
  }
  local_17c = 0x28;
  sVar5 = fwrite((void *)((long)&i + 4),0xec,1,(FILE *)this->fd_);
  if (sVar5 == 1) {
    if (tmp < 5) {
      pvVar6 = (void *)std::__cxx11::string::c_str();
      sVar5 = fwrite(pvVar6,(long)tmp,1,(FILE *)this->fd_);
      if (sVar5 == 1) {
        local_180 = 4 - tmp;
        iVar1 = fseek((FILE *)this->fd_,(long)local_180,1);
        if (iVar1 != -1) {
LAB_0011af6e:
          local_180 = 9;
          sVar5 = fwrite(&local_180,4,1,(FILE *)this->fd_);
          if (sVar5 == 1) {
            local_180 = 0;
            sVar5 = fwrite(&local_180,4,1,(FILE *)this->fd_);
            if (sVar5 == 1) {
              local_17c = local_17c + 8;
              iVar1 = fseek((FILE *)this->fd_,0xc4,0);
              if (((iVar1 != -1) && (sVar5 = fwrite(&local_17c,4,1,(FILE *)this->fd_), sVar5 == 1))
                 && (iVar1 = fseek((FILE *)this->fd_,0,2), iVar1 != -1)) {
                this->byteswap_ = false;
                poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                                         "FileWrite: creating MAT-file: ");
                std::operator<<(poVar4,(string *)fileName);
                Stk::handleError(&this->super_Stk,STATUS);
                this_local._7_1_ = true;
                goto LAB_0011b157;
              }
            }
          }
        }
      }
    }
    else {
      sVar5 = fwrite(&tmp,4,1,(FILE *)this->fd_);
      if (sVar5 == 1) {
        pvVar6 = (void *)std::__cxx11::string::c_str();
        sVar5 = fwrite(pvVar6,(long)tmp,1,(FILE *)this->fd_);
        if (sVar5 == 1) {
          dVar7 = ceil((double)((float)tmp * 0.125));
          local_180 = (int)dVar7;
          iVar1 = fseek((FILE *)this->fd_,(long)(local_180 * 8 - tmp),1);
          if (iVar1 != -1) {
            local_17c = local_180 * 8 + local_17c;
            goto LAB_0011af6e;
          }
        }
      }
    }
  }
  poVar4 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                           "FileWrite: could not write MAT-file header for file ");
  poVar4 = std::operator<<(poVar4,(string *)fileName);
  std::operator<<(poVar4,'.');
  this_local._7_1_ = false;
LAB_0011b157:
  std::__cxx11::string::~string((string *)&found);
  return this_local._7_1_;
}

Assistant:

bool FileWrite :: setMatFile( std::string fileName )
{
  if ( fileName.find( ".mat" ) == std::string::npos ) fileName += ".mat";
  fd_ = fopen( fileName.c_str(), "w+b" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create MAT file: " << fileName;
    return false;
  }

  if ( dataType_ != STK_FLOAT64 ) {
    dataType_ = STK_FLOAT64;
    oStream_ << "FileWrite: using 64-bit floating-point data format for file " << fileName << '.';
    handleError( StkError::DEBUG_PRINT );
  }

  struct MatHeader hdr;
  strcpy( hdr.heading,"MATLAB 5.0 MAT-file, Generated using the Synthesis ToolKit in C++ (STK). By Perry R. Cook and Gary P. Scavone." );
  for ( size_t i =strlen(hdr.heading); i<124; i++ ) hdr.heading[i] = ' ';

  // Header Flag Fields
  hdr.hff[0] = (SINT16) 0x0100;   // Version field
  hdr.hff[1] = (SINT16) 'M';      // Endian indicator field ("MI")
  hdr.hff[1] <<= 8;
  hdr.hff[1] += 'I';

  // Write sample rate in array data element
  hdr.fs[0] = (SINT32) 14;       // Matlab array data type value
  hdr.fs[1] = (SINT32) 56;        // Size of data element to follow (in bytes)

  // Numeric Array Subelements (4):
  // 1. Array Flags
  hdr.fs[2] = (SINT32) 6;     // Matlab 32-bit unsigned integer data type value
  hdr.fs[3] = (SINT32) 8;     // 8 bytes of data to follow
  hdr.fs[4] = (SINT32) 6;     // Double-precision array, no array flags set
  hdr.fs[5] = (SINT32) 0;     // 4 bytes undefined
  // 2. Array Dimensions
  hdr.fs[6] = (SINT32) 5;     // Matlab 32-bit signed integer data type value
  hdr.fs[7] = (SINT32) 8;     // 8 bytes of data to follow (2D array)
  hdr.fs[8] = (SINT32) 1;     // 1 row
  hdr.fs[9] = (SINT32) 1;     // 1 column
  // 3. Array Name (small data format element)
  hdr.fs[10] = 0x00020001;
  hdr.fs[11] = 's' << 8;
  hdr.fs[11] += 'f';
  // 4. Real Part
  hdr.fs[12] = 9;             // Matlab IEEE 754 double data type
  hdr.fs[13] = 8;             // 8 bytes of data to follow
  FLOAT64 *sampleRate = (FLOAT64 *)&hdr.fs[14];
  *sampleRate = (FLOAT64) Stk::sampleRate();

  // Write audio samples in array data element
  hdr.adf[0] = (SINT32) 14;       // Matlab array data type value
  hdr.adf[1] = (SINT32) 0;        // Size of file after this point to end (in bytes)

  // Numeric Array Subelements (4):
  // 1. Array Flags
  hdr.adf[2] = (SINT32) 6;        // Matlab 32-bit unsigned integer data type value
  hdr.adf[3] = (SINT32) 8;        // 8 bytes of data to follow
  hdr.adf[4] = (SINT32) 6;        // Double-precision array, no array flags set
  hdr.adf[5] = (SINT32) 0;        // 4 bytes undefined
  // 2. Array Dimensions
  hdr.adf[6] = (SINT32) 5;        // Matlab 32-bit signed integer data type value
  hdr.adf[7] = (SINT32) 8;        // 8 bytes of data to follow (2D array)
  hdr.adf[8] = (SINT32) channels_; // This is the number of rows
  hdr.adf[9] = (SINT32) 0;        // This is the number of columns

  // 3. Array Name We'll use fileName for the matlab array name (as
  // well as the file name), though we might need to strip off a
  // leading directory path.  If fileName is 4 characters or less, we
  // have to use a small data format element for the array name data
  // element.  Otherwise, the array name must be formatted in 8-byte
  // increments (up to 31 characters + NULL).
  std::string name = fileName;
  size_t found;
  found = name.find_last_of("/\\");
  name = name.substr(found+1);
  SINT32 namelength = (SINT32) name.size() - 4; // strip off the ".mat" extension
  if ( namelength > 31 ) namelength = 31; // Truncate name to 31 characters.
  if ( namelength > 4 ) {
    hdr.adf[10] = (SINT32) 1;        // Matlab 8-bit signed integer data type value
  }
  else { // Compressed data element format
    hdr.adf[10] = (namelength << 16) + 1;
  }

  SINT32 headsize = 40;        // Number of bytes in audio data element so far.

  // Write the fixed portion of the header
  if ( fwrite(&hdr, 236, 1, fd_) != 1 ) goto error;

  // Write MATLAB array name
  SINT32 tmp;
  if ( namelength > 4 ) {
    if ( fwrite(&namelength, 4, 1, fd_) != 1) goto error;
    if ( fwrite(name.c_str(), namelength, 1, fd_) != 1 ) goto error;
    tmp = (SINT32) ceil((float)namelength / 8);
    if ( fseek(fd_, tmp*8-namelength, SEEK_CUR) == -1 ) goto error;
    headsize += tmp * 8;
  }
  else { // Compressed data element format
    if ( fwrite(name.c_str(), namelength, 1, fd_) != 1 ) goto error;
    tmp = 4 - namelength;
    if ( fseek(fd_, tmp, SEEK_CUR) == -1 ) goto error;
  }

  // Finish writing known header information
  //4. Real Part
  tmp = 9;        // Matlab IEEE 754 double data type
  if ( fwrite(&tmp, 4, 1, fd_) != 1 ) goto error;
  tmp = 0;        // Size of real part subelement in bytes (8 per sample)
  if ( fwrite(&tmp, 4, 1, fd_) != 1 ) goto error;
  headsize += 8;  // Total number of bytes in data element so far

  if ( fseek(fd_, 196, SEEK_SET) == -1 ) goto error;
  if ( fwrite(&headsize, 4, 1, fd_) != 1 ) goto error; // Write header size ... will update at end
  if ( fseek(fd_, 0, SEEK_END) == -1 ) goto error;

  byteswap_ = false;
  oStream_ << "FileWrite: creating MAT-file: " << fileName;
  handleError( StkError::STATUS );

  return true;

 error:
  oStream_ << "FileWrite: could not write MAT-file header for file " << fileName << '.';
  return false;
}